

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

uoffset_t __thiscall flatbuffers::Parser::ParseVector(Parser *this,Type *type)

{
  FlatBufferBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer pcVar3;
  pointer pFVar4;
  double dVar5;
  Offset<void> off;
  ulong uVar6;
  uint8_t *puVar7;
  ulonglong uVar8;
  ulonglong *puVar9;
  float *pfVar10;
  double *pdVar11;
  int *piVar12;
  int iVar13;
  size_t sVar14;
  uint litle_endian_element;
  int iVar15;
  size_t alignment;
  Value local_108;
  BaseType local_c8;
  BaseType BStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  EnumDef *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  int local_90;
  undefined8 local_88;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> local_78;
  
  iVar15 = 0;
  if (this->token_ != 0x5d) {
    paVar1 = &local_78.first.constant.field_2;
    iVar15 = 0;
    do {
      local_108.constant._M_dataplus._M_p = (pointer)&local_108.constant.field_2;
      local_108.constant.field_2._M_allocated_capacity._0_2_ = 0x30;
      local_108.constant._M_string_length = 1;
      local_108.offset = -1;
      local_108.type.base_type = type->base_type;
      local_108.type.element = type->element;
      local_108.type.struct_def = type->struct_def;
      local_108.type.enum_def = type->enum_def;
      ParseAnyValue(this,&local_108,(FieldDef *)0x0);
      local_b8 = local_108.type.enum_def;
      local_c8 = local_108.type.base_type;
      BStack_c4 = local_108.type.element;
      uStack_c0 = local_108.type.struct_def._0_4_;
      uStack_bc = local_108.type.struct_def._4_4_;
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_108.constant._M_dataplus._M_p,
                 local_108.constant._M_dataplus._M_p + local_108.constant._M_string_length);
      local_90 = local_108.offset;
      local_88 = 0;
      local_78.first.type.element = BStack_c4;
      local_78.first.type.base_type = local_c8;
      local_78.first.type.struct_def = (StructDef *)CONCAT44(uStack_bc,uStack_c0);
      local_78.first.type.enum_def = local_b8;
      if (local_b0 == &local_a0) {
        local_78.first.constant.field_2._8_8_ = local_a0._8_8_;
        local_78.first.constant._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.first.constant._M_dataplus._M_p = (pointer)local_b0;
      }
      local_78.first.constant.field_2._M_allocated_capacity._1_7_ =
           local_a0._M_allocated_capacity._1_7_;
      local_78.first.constant.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
      local_78.first.constant._M_string_length = local_a8;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_78.first.offset = local_108.offset;
      local_78.second = (FieldDef *)0x0;
      local_b0 = &local_a0;
      std::
      vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
      ::emplace_back<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>
                ((vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                  *)&this->field_stack_,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.first.constant._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.first.constant._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      iVar13 = this->token_;
      if (iVar13 != 0x5d) {
        Expect(this,0x2c);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.constant._M_dataplus._M_p != &local_108.constant.field_2) {
        operator_delete(local_108.constant._M_dataplus._M_p);
      }
      iVar15 = iVar15 + 1;
    } while (iVar13 != 0x5d);
  }
  Next(this);
  uVar6 = (ulong)type->base_type;
  if ((uVar6 == 0xf) && (type->struct_def->fixed == true)) {
    sVar14 = type->struct_def->bytesize;
  }
  else {
    sVar14 = (size_t)(char)kTypeSizes[uVar6];
  }
  this_00 = &this->builder_;
  if ((type->base_type == BASE_TYPE_STRUCT) && (type->struct_def->fixed == true)) {
    alignment = type->struct_def->minalign;
  }
  else {
    alignment = (size_t)(char)kTypeSizes[uVar6];
  }
  sVar14 = sVar14 * (long)iVar15 * alignment;
  FlatBufferBuilder::PreAlign(this_00,sVar14,4);
  FlatBufferBuilder::PreAlign(this_00,sVar14,alignment);
  iVar13 = iVar15;
  if (0 < iVar15) {
    do {
      ppVar2 = (this->field_stack_).
               super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      switch(ppVar2[-1].first.type.base_type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR:
        uVar8 = strtoull(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,8);
        FlatBufferBuilder::Align(this_00,1);
        puVar7 = vector_downward::make_space(&this_00->buf_,1);
        *puVar7 = (uint8_t)uVar8;
        break;
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT:
        uVar8 = strtoull(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,0x10);
        FlatBufferBuilder::Align(this_00,2);
        puVar7 = vector_downward::make_space(&this_00->buf_,2);
        *(short *)puVar7 = (short)uVar8;
        break;
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
        uVar8 = strtoull(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        CheckBitsFit(uVar8,0x20);
        FlatBufferBuilder::Align(this_00,4);
        puVar7 = vector_downward::make_space(&this_00->buf_,4);
        *(int *)puVar7 = (int)uVar8;
        break;
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        uVar8 = strtoull(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0,10);
        FlatBufferBuilder::Align(this_00,8);
        puVar9 = (ulonglong *)vector_downward::make_space(&this_00->buf_,8);
        *puVar9 = uVar8;
        break;
      case BASE_TYPE_FLOAT:
        dVar5 = strtod(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0);
        FlatBufferBuilder::Align(this_00,4);
        pfVar10 = (float *)vector_downward::make_space(&this_00->buf_,4);
        *pfVar10 = (float)dVar5;
        break;
      case BASE_TYPE_DOUBLE:
        dVar5 = strtod(ppVar2[-1].first.constant._M_dataplus._M_p,(char **)0x0);
        FlatBufferBuilder::Align(this_00,8);
        pdVar11 = (double *)vector_downward::make_space(&this_00->buf_,8);
        *pdVar11 = dVar5;
        break;
      case BASE_TYPE_STRING:
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_UNION:
switchD_0010cd61_caseD_d:
        off.o = atoi(ppVar2[-1].first.constant._M_dataplus._M_p);
        FlatBufferBuilder::PushElement<void>(this_00,off);
        break;
      case BASE_TYPE_STRUCT:
        if ((ppVar2[-1].first.type.struct_def)->fixed != true) goto switchD_0010cd61_caseD_d;
        SerializeStruct(this,ppVar2[-1].first.type.struct_def,&ppVar2[-1].first);
      }
      ppVar2 = (this->field_stack_).
               super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->field_stack_).
      super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar2 + -1;
      pcVar3 = ppVar2[-1].first.constant._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &ppVar2[-1].first.constant.field_2) {
        operator_delete(pcVar3);
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  pFVar4 = (this->builder_).offsetbuf_.
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->builder_).offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar4) {
    (this->builder_).offsetbuf_.
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
  }
  FlatBufferBuilder::Align(this_00,4);
  piVar12 = (int *)vector_downward::make_space(&this_00->buf_,4);
  *piVar12 = iVar15;
  return ((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
         *(int *)&(this->builder_).buf_.buf_;
}

Assistant:

uoffset_t Parser::ParseVector(const Type &type) {
  int count = 0;
  if (token_ != ']') for (;;) {
    Value val;
    val.type = type;
    ParseAnyValue(val, NULL);
    field_stack_.push_back(std::make_pair(val, nullptr));
    count++;
    if (token_ == ']') break;
    Expect(',');
  }
  Next();

  builder_.StartVector(count * InlineSize(type), InlineAlignment((type)));
  for (int i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else builder_.PushElement(atot<CTYPE>(val.constant.c_str())); \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  return builder_.EndVector(count);
}